

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteStateMachine.hpp
# Opt level: O0

shared_ptr<peach::fsm::Node> __thiscall
peach::fsm::Node::addTransitionToNewNode<peach::transition::SingleCharTransition,char_const&>
          (Node *this,tokenCategory_t category,char *args)

{
  char *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<peach::fsm::Node> sVar1;
  shared_ptr<peach::fsm::Node> local_40;
  undefined1 local_29;
  char *local_28;
  char *args_local;
  tokenCategory_t category_local;
  Node *this_local;
  shared_ptr<peach::fsm::Node> *newNode;
  
  local_29 = 0;
  local_28 = in_RCX;
  args_local = args;
  category_local = category;
  this_local = this;
  std::make_shared<peach::fsm::Node,unsigned_long&>((unsigned_long *)this);
  std::shared_ptr<peach::fsm::Node>::shared_ptr(&local_40,(shared_ptr<peach::fsm::Node> *)this);
  addTransition<peach::transition::SingleCharTransition,char_const&>
            ((Node *)category,&local_40,local_28);
  std::shared_ptr<peach::fsm::Node>::~shared_ptr(&local_40);
  sVar1.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<peach::fsm::Node>)
         sVar1.super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> addTransitionToNewNode(token::tokenCategory_t category, TransitionArgs &&... args)
    {
        auto newNode = std::make_shared<Node>(category);
        addTransition<Transition>(newNode, std::forward<TransitionArgs>(args)...);
        return newNode;
    }